

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_vspltisw_vinsertw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  uint uVar1;
  ulong a2;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar1 = ctx->opcode;
  if ((uVar1 & 1) == 0) {
    if ((ctx->insns_flags & 0x1000000) == 0) {
LAB_00bbda1c:
      gen_exception_err(ctx,0x60,0x21);
      return;
    }
    if (ctx->altivec_enabled != false) {
      tcg_gen_gvec_dup32i_ppc64
                (ctx->uc->tcg_ctx,(uVar1 >> 0x11 & 0x1f0) + 0x12d20,0x10,0x10,
                 (int)(uVar1 << 0xb) >> 0x1b);
      return;
    }
  }
  else {
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00bbda1c;
    if (ctx->altivec_enabled != false) {
      uVar1 = uVar1 >> 0x10 & 0xf;
      s = ctx->uc->tcg_ctx;
      ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
      a2 = (ulong)uVar1;
      if (0xc < uVar1) {
        a2 = 0;
      }
      tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)ts,a2);
      uVar1 = ctx->opcode;
      ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_ppc64
                (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)s->cpu_env,
                 (ulong)(uVar1 >> 7 & 0x1f0) + 0x12d20);
      uVar1 = ctx->opcode;
      ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_ppc64
                (s,(TCGv_i64)((long)ts_01 - (long)s),(TCGv_i64)s->cpu_env,
                 (ulong)(uVar1 >> 0x11 & 0x1f0) + 0x12d20);
      local_48 = ts_01;
      local_40 = ts_00;
      local_38 = ts;
      tcg_gen_callN_ppc64(s,helper_vinsertw_ppc64,(TCGTemp *)0x0,3,&local_48);
      tcg_temp_free_internal_ppc64(s,ts);
      tcg_temp_free_internal_ppc64(s,ts_00);
      tcg_temp_free_internal_ppc64(s,ts_01);
      return;
    }
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vsldoi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_ptr ra, rb, rd;
    TCGv_i32 sh;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    ra = gen_avr_ptr(tcg_ctx, rA(ctx->opcode));
    rb = gen_avr_ptr(tcg_ctx, rB(ctx->opcode));
    rd = gen_avr_ptr(tcg_ctx, rD(ctx->opcode));
    sh = tcg_const_i32(tcg_ctx, VSH(ctx->opcode));
    gen_helper_vsldoi(tcg_ctx, rd, ra, rb, sh);
    tcg_temp_free_ptr(tcg_ctx, ra);
    tcg_temp_free_ptr(tcg_ctx, rb);
    tcg_temp_free_ptr(tcg_ctx, rd);
    tcg_temp_free_i32(tcg_ctx, sh);
}